

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O0

void av1_svc_check_reset_layer_rc_flag(AV1_COMP *cpi)

{
  LAYER_CONTEXT *pLVar1;
  int iVar2;
  PRIMARY_RATE_CONTROL *lp_rc;
  PRIMARY_RATE_CONTROL *lp_rc2;
  RATE_CONTROL *lrc2;
  LAYER_CONTEXT *lc2;
  int layer2;
  int tl;
  int prev_avg_frame_bandwidth;
  int avg_frame_bandwidth;
  RATE_CONTROL *lrc;
  LAYER_CONTEXT *lc;
  int layer;
  int sl;
  SVC *svc;
  AV1_COMP *cpi_local;
  
  for (sl = 0; sl < (cpi->svc).number_spatial_layers; sl = sl + 1) {
    iVar2 = sl * (cpi->svc).number_temporal_layers + (cpi->svc).number_temporal_layers + -1;
    pLVar1 = (cpi->svc).layer_context;
    avg_frame_bandwidth = pLVar1[iVar2].rc.avg_frame_bandwidth;
    prev_avg_frame_bandwidth = pLVar1[iVar2].rc.prev_avg_frame_bandwidth;
    if ((avg_frame_bandwidth == 0) || (prev_avg_frame_bandwidth == 0)) {
      iVar2 = sl * (cpi->svc).number_temporal_layers;
      pLVar1 = (cpi->svc).layer_context;
      avg_frame_bandwidth = pLVar1[iVar2].rc.avg_frame_bandwidth;
      prev_avg_frame_bandwidth = pLVar1[iVar2].rc.prev_avg_frame_bandwidth;
    }
    if ((prev_avg_frame_bandwidth >> 1 < avg_frame_bandwidth / 3) ||
       (avg_frame_bandwidth < prev_avg_frame_bandwidth >> 1)) {
      for (tl = 0; tl < (cpi->svc).number_temporal_layers; tl = tl + 1) {
        iVar2 = sl * (cpi->svc).number_temporal_layers + tl;
        pLVar1 = (cpi->svc).layer_context;
        pLVar1[iVar2].rc.rc_1_frame = 0;
        pLVar1[iVar2].rc.rc_2_frame = 0;
        pLVar1[iVar2].p_rc.bits_off_target = pLVar1[iVar2].p_rc.optimal_buffer_level;
        pLVar1[iVar2].p_rc.buffer_level = pLVar1[iVar2].p_rc.optimal_buffer_level;
      }
    }
  }
  return;
}

Assistant:

void av1_svc_check_reset_layer_rc_flag(AV1_COMP *const cpi) {
  SVC *const svc = &cpi->svc;
  for (int sl = 0; sl < svc->number_spatial_layers; ++sl) {
    // Check for reset based on avg_frame_bandwidth for spatial layer sl.
    // If avg_frame_bandwidth for top temporal layer is not set
    // (because enhancement layer was inactive), use the base TL0
    int layer = LAYER_IDS_TO_IDX(sl, svc->number_temporal_layers - 1,
                                 svc->number_temporal_layers);
    LAYER_CONTEXT *lc = &svc->layer_context[layer];
    RATE_CONTROL *lrc = &lc->rc;
    int avg_frame_bandwidth = lrc->avg_frame_bandwidth;
    int prev_avg_frame_bandwidth = lrc->prev_avg_frame_bandwidth;
    if (avg_frame_bandwidth == 0 || prev_avg_frame_bandwidth == 0) {
      // Use base TL0.
      layer = LAYER_IDS_TO_IDX(sl, 0, svc->number_temporal_layers);
      lc = &svc->layer_context[layer];
      lrc = &lc->rc;
      avg_frame_bandwidth = lrc->avg_frame_bandwidth;
      prev_avg_frame_bandwidth = lrc->prev_avg_frame_bandwidth;
    }
    if (avg_frame_bandwidth / 3 > (prev_avg_frame_bandwidth >> 1) ||
        avg_frame_bandwidth < (prev_avg_frame_bandwidth >> 1)) {
      // Reset for all temporal layers with spatial layer sl.
      for (int tl = 0; tl < svc->number_temporal_layers; ++tl) {
        int layer2 = LAYER_IDS_TO_IDX(sl, tl, svc->number_temporal_layers);
        LAYER_CONTEXT *lc2 = &svc->layer_context[layer2];
        RATE_CONTROL *lrc2 = &lc2->rc;
        PRIMARY_RATE_CONTROL *lp_rc2 = &lc2->p_rc;
        PRIMARY_RATE_CONTROL *const lp_rc = &lc2->p_rc;
        lrc2->rc_1_frame = 0;
        lrc2->rc_2_frame = 0;
        lp_rc2->bits_off_target = lp_rc->optimal_buffer_level;
        lp_rc2->buffer_level = lp_rc->optimal_buffer_level;
      }
    }
  }
}